

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool detect_stuff(effect_handler_context_t_conflict *context,_func__Bool_object_ptr *pred)

{
  _Bool _Var1;
  int iVar2;
  loc grid;
  object *obj;
  _func__Bool_object_ptr *in_RDX;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int y;
  int iVar6;
  bool bVar7;
  
  iVar2 = (player->grid).x;
  iVar5 = (player->grid).y;
  y = iVar5 - (int)context;
  iVar5 = iVar5 + (int)context;
  iVar4 = iVar2 - (int)pred;
  _Var3 = false;
  if (y < 1) {
    y = 0;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  iVar6 = cave->height + -1;
  if (iVar5 < cave->height) {
    iVar6 = iVar5;
  }
  if (y <= iVar6) {
    iVar2 = iVar2 + (int)pred;
    iVar5 = cave->width + -1;
    if (iVar2 < cave->width) {
      iVar5 = iVar2;
    }
    _Var3 = false;
    do {
      iVar2 = iVar4;
      if (iVar4 <= iVar5) {
        do {
          grid = (loc)loc(iVar2,y);
          obj = square_object(cave,grid);
          if (!_Var3) {
            for (; obj != (object *)0x0; obj = obj->next) {
              _Var1 = (*in_RDX)(obj);
              if ((_Var1) && (_Var1 = ignore_item_ok(player,obj), !_Var1)) {
                _Var3 = true;
              }
              if (_Var3 != false) break;
            }
          }
          square_know_pile(cave,grid,in_RDX);
          bVar7 = iVar2 != iVar5;
          iVar2 = iVar2 + 1;
        } while (bVar7);
      }
      bVar7 = y != iVar6;
      y = y + 1;
    } while (bVar7);
  }
  return _Var3;
}

Assistant:

static bool detect_stuff(effect_handler_context_t *context,
		bool (*pred)(const struct object*))
{
	int x, y;
	int x1, x2, y1, y2;

	bool have_stuff = false;

	/* Pick an area to detect */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the area */
	for (y = y1; y <= y2; y++) {
		for (x = x1; x <= x2; x++) {
			struct loc grid = loc(x, y);
			struct object *obj = square_object(cave, grid);

			/*
			 * Is there any object matching the predicate which is
			 * not ignored?
			 */
			for (; !have_stuff && obj; obj = obj->next) {
				if ((*pred)(obj) && !ignore_item_ok(player, obj)) {
					have_stuff = true;
				}
			}

			/*
			 * Mark the parts of the pile that match the predicate
			 * as seen.  Forget remembered parts that match the
			 * predicate which are no longer there.
			 */
			square_know_pile(cave, grid, pred);
		}
	}

	return have_stuff;
}